

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

void __thiscall
helics::RerouteFilterOperation::setString
          (RerouteFilterOperation *this,string_view property,string_view val)

{
  int iVar1;
  size_t __len;
  char *__p;
  size_type __rlen;
  regex test;
  handle cond;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_80;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_60;
  unique_lock<std::shared_mutex> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __p = val._M_str;
  __len = val._M_len;
  local_40._M_len = __len;
  local_40._M_str = __p;
  if (property._M_len == 9) {
    iVar1 = bcmp(property._M_str,"condition",9);
    if (iVar1 == 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_80,__p,__len,0x10);
      local_60 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->conditions;
      local_58._M_device = &(this->conditions).m_mutex;
      local_58._M_owns = false;
      std::unique_lock<std::shared_mutex>::lock(&local_58);
      local_58._M_owns = true;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>&>(local_60,&local_40);
      std::unique_lock<std::shared_mutex>::~unique_lock(&local_58);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_80);
    }
  }
  else if ((property._M_len == 0xe) &&
          (iVar1 = bcmp(property._M_str,"newdestination",0xe), iVar1 == 0)) {
    gmlc::libguarded::atomic_guarded<std::__cxx11::string,std::mutex>::operator=
              ((atomic_guarded<std::__cxx11::string,std::mutex> *)&this->newDest,&local_40);
  }
  return;
}

Assistant:

void RerouteFilterOperation::setString(std::string_view property, std::string_view val)
{
    if (property == "newdestination") {
        newDest = val;
    } else if (property == "condition") {
        try {
            // this line is to verify that it is a valid regex
            auto test = std::regex(val.data(), val.size());
            auto cond = conditions.lock();
            cond->emplace(val);
        }
        catch (const std::regex_error& re) {
            std::cerr << "filter expression is not a valid Regular expression " << re.what()
                      << '\n';
            throw(helics::InvalidParameter(
                std::string("filter expression is not a valid Regular expression ") + re.what()));
        }
    }
}